

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_vec3f ma_atomic_vec3f_get(ma_atomic_vec3f *v)

{
  ma_spinlock mVar1;
  
  while( true ) {
    LOCK();
    mVar1 = v->lock;
    v->lock = 1;
    UNLOCK();
    if (mVar1 == 0) break;
    do {
    } while (v->lock == 1);
  }
  v->lock = 0;
  return v->v;
}

Assistant:

MA_API ma_vec3f ma_atomic_vec3f_get(ma_atomic_vec3f* v)
{
    ma_vec3f r;

    ma_spinlock_lock(&v->lock);
    {
        r = v->v;
    }
    ma_spinlock_unlock(&v->lock);

    return r;
}